

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void textfont_cb(Fl_Choice *i,void *v)

{
  Fl_Menu_Item *pFVar1;
  Fl_Type *pFVar2;
  bool bVar3;
  int iVar4;
  Fl_Widget_Type *q;
  Fl_Type **ppFVar5;
  Fl_Font n;
  Fl_Color c;
  int s;
  
  if ((char *)v == "LOAD") {
    iVar4 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x2b])(current_widget,0,&n,&s,&c);
    if (iVar4 == 0) {
      Fl_Widget::deactivate((Fl_Widget *)i);
    }
    else {
      Fl_Widget::activate((Fl_Widget *)i);
      if (0xf < n) {
        n = 0;
      }
      Fl_Choice::value(i,n);
    }
  }
  else {
    pFVar1 = (i->super_Fl_Menu_).value_;
    if (pFVar1 == (Fl_Menu_Item *)0x0) {
      n = -1;
    }
    else {
      n = (Fl_Font)(((long)pFVar1 - (long)(i->super_Fl_Menu_).menu_) / 0x38);
    }
    bVar3 = false;
    ppFVar5 = &Fl_Type::first;
    while (pFVar2 = *ppFVar5, pFVar2 != (Fl_Type *)0x0) {
      if (pFVar2->selected != '\0') {
        iVar4 = (*pFVar2->_vptr_Fl_Type[0x17])(pFVar2);
        if (iVar4 != 0) {
          (*pFVar2->_vptr_Fl_Type[0x2b])(pFVar2,1,&n,&s,&c);
          Fl_Widget::redraw((Fl_Widget *)pFVar2[1].prev);
          bVar3 = true;
        }
      }
      ppFVar5 = &pFVar2->next;
    }
    if (bVar3) {
      set_modflag(1);
    }
  }
  return;
}

Assistant:

void textfont_cb(Fl_Choice* i, void* v) {
  Fl_Font n; int s; Fl_Color c;
  if (v == LOAD) {
    if (!current_widget->textstuff(0,n,s,c)) {i->deactivate(); return;}
    i->activate();
    if (n > 15) n = FL_HELVETICA;
    i->value(n);
  } else {
    int mod = 0;
    n = (Fl_Font)i->value();
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	q->textstuff(1,n,s,c);
	q->o->redraw();
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}